

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O0

char * __thiscall tinyxml2::XMLAttribute::ParseDeep(XMLAttribute *this,char *p,bool processEntities)

{
  char *pcVar1;
  char *in_RDI;
  char *unaff_retaddr;
  undefined7 in_stack_00000008;
  char endTag [2];
  int strFlags;
  StrPair *in_stack_fffffffffffffff8;
  
  pcVar1 = StrPair::ParseName(in_stack_fffffffffffffff8,in_RDI);
  strFlags = (int)((ulong)in_RDI >> 0x20);
  if ((pcVar1 == (char *)0x0) || (*pcVar1 == '\0')) {
    pcVar1 = (char *)0x0;
  }
  else {
    pcVar1 = XMLUtil::SkipWhiteSpace((char *)0x2c3f8c);
    if (*pcVar1 == '=') {
      pcVar1 = XMLUtil::SkipWhiteSpace((char *)0x2c3fc4);
      if ((*pcVar1 == '\"') || (*pcVar1 == '\'')) {
        pcVar1 = StrPair::ParseText((StrPair *)CONCAT17(processEntities,in_stack_00000008),
                                    unaff_retaddr,(char *)in_stack_fffffffffffffff8,strFlags);
      }
      else {
        pcVar1 = (char *)0x0;
      }
    }
    else {
      pcVar1 = (char *)0x0;
    }
  }
  return pcVar1;
}

Assistant:

char* XMLAttribute::ParseDeep( char* p, bool processEntities )
{
    // Parse using the name rules: bug fix, was using ParseText before
    p = _name.ParseName( p );
    if ( !p || !*p ) {
        return 0;
    }

    // Skip white space before =
    p = XMLUtil::SkipWhiteSpace( p );
    if ( *p != '=' ) {
        return 0;
    }

    ++p;	// move up to opening quote
    p = XMLUtil::SkipWhiteSpace( p );
    if ( *p != '\"' && *p != '\'' ) {
        return 0;
    }

    char endTag[2] = { *p, 0 };
    ++p;	// move past opening quote

    p = _value.ParseText( p, endTag, processEntities ? StrPair::ATTRIBUTE_VALUE : StrPair::ATTRIBUTE_VALUE_LEAVE_ENTITIES );
    return p;
}